

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout_mapping_right.hpp
# Opt level: O0

size_type __thiscall
std::experimental::detail::
layout_mapping_right_indexer<std::experimental::dimensions<15ul,30ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,2ul,void>
::operator()(void)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  value_type vVar5;
  size_type R;
  layout_mapping_right_indexer<std::experimental::dimensions<15UL,_30UL,_30UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_2UL,_void>
  *this_local;
  
  vVar1 = dimensions<15UL,_30UL,_30UL>::operator[]<unsigned_long>
                    ((dimensions<15UL,_30UL,_30UL> *)((long)&this_local + 7),1);
  vVar2 = dimensions<1UL,_1UL,_1UL>::operator[]<unsigned_long>
                    ((dimensions<1UL,_1UL,_1UL> *)((long)&this_local + 6),1);
  vVar3 = dimensions<0UL,_0UL,_0UL>::operator[]<unsigned_long>
                    ((dimensions<0UL,_0UL,_0UL> *)((long)&this_local + 5),1);
  vVar4 = dimensions<1UL,_1UL,_1UL>::operator[]<unsigned_long>
                    ((dimensions<1UL,_1UL,_1UL> *)((long)&this_local + 6),0);
  vVar5 = dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<unsigned_long>
                    ((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                      *)&stack0x00000008,0);
  return (vVar1 * vVar2 + vVar3) * vVar4 * vVar5;
}

Assistant:

typename layout_mapping_right<Dimensions, Stepping, Padding>::size_type
    operator()(
        Dimensions d
      , Stepping step
      , Padding pad
      , dimensions<IdxDims...> i
        ) const noexcept
    {
        static_assert(
            (0                 <= N) 
          , "Dimension rank N is negative in layout_mapping_right."
        );
        static_assert(
            Dimensions::rank() >  N
          , "Dimension rank N is greater than the rank of Dimensions "
            "(out of bounds) in layout_mapping_right."
        );
        auto constexpr R = Dimensions::rank();
        return (d[R - N] * step[R - N] + pad[R - N])
             * (step[(R - 1) - N] * i[(R - 1) - N]);
    }